

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

int __thiscall QAccessibleTable::indexOfChild(QAccessibleTable *this,QAccessibleInterface *iface)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar5;
  long *plVar6;
  QAbstractItemView *pQVar7;
  QListView *this_01;
  QHeaderView *pQVar8;
  QHeaderView *pQVar9;
  QDebug *pQVar10;
  QAccessibleTableHeaderCell *cell;
  uint uVar11;
  long in_FS_OFFSET;
  QString local_a8;
  QModelIndex local_90;
  char *local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  uVar11 = 0xffffffff;
  if (this_00 != (QAbstractItemView *)0x0) {
    pQVar5 = QAbstractItemView::model(this_00);
    if (pQVar5 != (QAbstractItemModel *)0x0) {
      plVar6 = (long *)(**(code **)(*(long *)iface + 0x40))(iface);
      pQVar7 = (QAbstractItemView *)(**(code **)(*plVar6 + 0x18))(plVar6);
      if (pQVar7 == this_00) {
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QAbstractItemView::rootIndex(&local_58,this_00);
        iVar2 = (**(code **)(*(long *)iface + 0x78))(iface);
        if (iVar2 != 0x1d) {
          iVar2 = (**(code **)(*(long *)iface + 0x78))(iface);
          if (iVar2 != 0x22) {
            iVar2 = (**(code **)(*(long *)iface + 0x78))(iface);
            if (iVar2 == 0x19) {
              iVar2 = *(int *)(iface + 0x18);
              pQVar8 = verticalHeader(this);
              uVar11 = (iVar2 + 1) - (uint)(pQVar8 == (QHeaderView *)0x0);
            }
            else {
              iVar2 = (**(code **)(*(long *)iface + 0x78))(iface);
              if (iVar2 == 0x1a) {
                iVar2 = *(int *)(iface + 0x18);
                iVar4 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_58);
                uVar11 = (iVar4 + 1) * (iVar2 + 1);
              }
              else {
                iVar2 = (**(code **)(*(long *)iface + 0x78))(iface);
                uVar11 = 0;
                if (iVar2 != 0x10) {
                  local_90.r = 2;
                  local_90._4_8_ = 0;
                  local_90.i._4_4_ = 0;
                  local_90.m.ptr._0_4_ = 0;
                  local_90.m.ptr._4_4_ = 0;
                  local_78 = "default";
                  QMessageLogger::warning();
                  pQVar10 = QDebug::operator<<(&local_70,
                                               "WARNING QAccessibleTable::indexOfChild Fix my children..."
                                              );
                  local_68.stream = pQVar10->stream;
                  *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
                  uVar11 = (**(code **)(*(long *)iface + 0x78))(iface);
                  qt_QMetaEnum_debugOperator
                            (&local_60,(longlong)&local_68,(QMetaObject *)(ulong)uVar11,
                             (char *)&QAccessible::staticMetaObject);
                  (**(code **)(*(long *)iface + 0x60))(&local_a8,iface,0);
                  QDebug::operator<<(&local_60,&local_a8);
                  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QDebug::~QDebug(&local_60);
                  QDebug::~QDebug(&local_68);
                  QDebug::~QDebug(&local_70);
                  uVar11 = 0xffffffff;
                }
              }
            }
            goto LAB_00533221;
          }
        }
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_90,(QPersistentModelIndex *)(iface + 0x28));
        uVar11 = 0xffffffff;
        if ((CONCAT44(local_90.m.ptr._4_4_,local_90.m.ptr._0_4_) != 0) &&
           (iVar2 = local_90.c, -1 < (local_90.r | local_90.c))) {
          if (this->m_role == List) {
            (**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
            QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
            this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
            uVar3 = QListView::modelColumn(this_01);
            uVar11 = 0xffffffff;
            if (iVar2 == uVar3) {
              uVar11 = local_90.r;
            }
          }
          else {
            pQVar8 = verticalHeader(this);
            pQVar9 = horizontalHeader(this);
            iVar2 = local_90.r + 1;
            iVar4 = (**(code **)(*(long *)this + 0x58))(this);
            uVar11 = (uint)(pQVar8 != (QHeaderView *)0x0) + local_90.c +
                     (iVar4 + (uint)(pQVar8 != (QHeaderView *)0x0)) *
                     (iVar2 - (uint)(pQVar9 == (QHeaderView *)0x0));
          }
        }
      }
    }
  }
LAB_00533221:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar11;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::indexOfChild(const QAccessibleInterface *iface) const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return -1;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return -1;
    QAccessibleInterface *parent = iface->parent();
    if (parent->object() != theView)
        return -1;

    const QModelIndex rootIndex = theView->rootIndex();
    Q_ASSERT(iface->role() != QAccessible::TreeItem); // should be handled by tree class
    if (iface->role() == QAccessible::Cell || iface->role() == QAccessible::ListItem) {
        const QAccessibleTableCell* cell = static_cast<const QAccessibleTableCell*>(iface);
        return logicalIndex(cell->m_index);
    } else if (iface->role() == QAccessible::ColumnHeader){
        const QAccessibleTableHeaderCell* cell = static_cast<const QAccessibleTableHeaderCell*>(iface);
        return cell->index + (verticalHeader() ? 1 : 0);
    } else if (iface->role() == QAccessible::RowHeader){
        const QAccessibleTableHeaderCell* cell = static_cast<const QAccessibleTableHeaderCell*>(iface);
        return (cell->index + 1) * (theModel->columnCount(rootIndex) + 1);
    } else if (iface->role() == QAccessible::Pane) {
        return 0; // corner button
    } else {
        qWarning() << "WARNING QAccessibleTable::indexOfChild Fix my children..."
                   << iface->role() << iface->text(QAccessible::Name);
    }
    // FIXME: we are in denial of our children. this should stop.
    return -1;
}